

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIError.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TextureBorderClampSamplerParameterIErrorTest::iterate
          (TextureBorderClampSamplerParameterIErrorTest *this)

{
  char *description;
  bool bVar1;
  
  (*(this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[5])();
  VerifyGLGetCallsForAllPNames(this,this->m_sampler_id,0);
  VerifyGLGetCallsForAllPNames(this,this->m_sampler_id + 1,0x502);
  VerifyGLSamplerCallsForAllPNames(this,this->m_sampler_id,0);
  VerifyGLSamplerCallsForAllPNames(this,this->m_sampler_id + 2,0x502);
  bVar1 = this->m_test_passed == '\0';
  if (bVar1) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx,(uint)bVar1,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBorderClampSamplerParameterIErrorTest::iterate(void)
{
	initTest();

	/* Verify glGetSamplerParameterIivEXT() and glGetSamplerParameterIuivEXT(),
	 * report GL_NO_ERROR if called for a generated sampler object*/
	VerifyGLGetCallsForAllPNames(m_sampler_id, GL_NO_ERROR);

	/* Verify glGetSamplerParameterIivEXT() and glGetSamplerParameterIuivEXT(),
	 * report GL_INVALID_OPERATION if called for a non-existent sampler object*/
	VerifyGLGetCallsForAllPNames(m_sampler_id + 1, GL_INVALID_OPERATION);

	/* Verify glSamplerParameterIivEXT() and glSamplerParameterIuivEXT(),
	 * report GL_NO_ERROR if called for a generated sampler object*/
	VerifyGLSamplerCallsForAllPNames(m_sampler_id, GL_NO_ERROR);

	/* Verify glSamplerParameterIivEXT() and glSamplerParameterIuivEXT(),
	 * report GL_INVALID_OPERATION if called for a non-existent sampler object*/
	VerifyGLSamplerCallsForAllPNames(m_sampler_id + 2, GL_INVALID_OPERATION);

	if (m_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}